

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int uv_fs_readdir(uv_loop_t *loop,uv_fs_t *req,char *path,int flags,uv_fs_cb cb)

{
  uv__work *w;
  long *plVar1;
  int iVar2;
  char *pcVar3;
  
  req->type = UV_FS;
  req->active_queue[0] = loop->active_reqs;
  plVar1 = (long *)loop->active_reqs[1];
  req->active_queue[1] = plVar1;
  *plVar1 = (long)req->active_queue;
  loop->active_reqs[1] = req->active_queue;
  req->fs_type = UV_FS_READDIR;
  req->result = 0;
  req->ptr = (void *)0x0;
  req->loop = loop;
  req->path = (char *)0x0;
  req->new_path = (char *)0x0;
  req->cb = cb;
  pcVar3 = strdup(path);
  req->path = pcVar3;
  if (pcVar3 == (char *)0x0) {
    iVar2 = -0xc;
  }
  else {
    req->flags = flags;
    w = &req->work_req;
    if (cb == (uv_fs_cb)0x0) {
      uv__fs_work(w);
      uv__fs_done(w,0);
      iVar2 = (int)req->result;
    }
    else {
      uv__work_submit(loop,w,uv__fs_work,uv__fs_done);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int uv_fs_readdir(uv_loop_t* loop,
                  uv_fs_t* req,
                  const char* path,
                  int flags,
                  uv_fs_cb cb) {
  INIT(READDIR);
  PATH;
  req->flags = flags;
  POST;
}